

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::TokenList::getChild
          (TokenOrSyntax *__return_storage_ptr__,TokenList *this,size_t index)

{
  pointer pTVar1;
  Info *pIVar2;
  
  pTVar1 = (this->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr + index;
  pIVar2 = pTVar1->info;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       *(undefined8 *)pTVar1;
  *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
            + 8) = pIVar2;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

void setChild(size_t index, TokenOrSyntax child) final { (*this)[index] = child.token(); }